

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<ki::dml::Field<short>_> * __thiscall
pybind11::class_<ki::dml::Field<short>>::
def_property_readonly<bool(ki::dml::FieldBase::*)()const,pybind11::return_value_policy>
          (class_<ki::dml::Field<short>> *this,char *name,offset_in_FieldBase_to_subr *fget,
          return_value_policy *extra)

{
  class_<ki::dml::Field<short>_> *pcVar1;
  return_value_policy local_29;
  cpp_function local_28;
  
  cpp_function::cpp_function<bool,ki::dml::Field<short>>(&local_28,*fget);
  local_29 = reference_internal;
  pcVar1 = def_property_readonly<pybind11::return_value_policy,pybind11::return_value_policy>
                     (this,name,&local_28,&local_29,extra);
  object::~object((object *)&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }